

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_input.cpp
# Opt level: O3

void MessagePump(SDL_Event *sev)

{
  ushort uVar1;
  Uint32 UVar2;
  SDL_Scancode SVar3;
  SDL_Scancode SVar4;
  char *pcVar5;
  undefined8 uVar6;
  Node *pNVar7;
  bool bVar8;
  short sVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  Node *pNVar13;
  int y;
  int x;
  event_t local_38;
  SWORD local_20 [2];
  SWORD local_1c [2];
  
  local_38.type = '\0';
  local_38.subtype = '\0';
  local_38.data1 = 0;
  local_38.data2 = 0;
  local_38.data3 = 0;
  local_38.x = 0;
  local_38.y = 0;
  UVar2 = sev->type;
  if ((int)UVar2 < 0x400) {
    if ((int)UVar2 < 0x300) {
      if (UVar2 != 0x200) {
        if (UVar2 != 0x100) {
          return;
        }
        exit(0);
      }
      if (((sev->display).event & 0xfe) != 0xc) {
        return;
      }
      S_SetSoundPaused((uint)((sev->display).event == 0xc));
      return;
    }
    if (UVar2 - 0x300 < 2) {
      if (!GUICapture) {
        SVar3 = (sev->window).data2;
        pNVar7 = (Node *)(KeySymToDIK.Nodes + (KeySymToDIK.Size + ~SDL_SCANCODE_UNKNOWN & SVar3));
        while ((pNVar13 = pNVar7, pNVar13 != (Node *)0x0 && (pNVar13->Next != (Node *)0x1))) {
          pNVar7 = pNVar13->Next;
          if ((pNVar13->Pair).Key == SVar3) goto LAB_002c79b5;
        }
        SVar4 = (sev->key).keysym.scancode;
        pNVar7 = KeyScanToDIK.Nodes + (KeyScanToDIK.Size + ~SDL_SCANCODE_UNKNOWN & SVar4);
        do {
          pNVar13 = pNVar7;
          if (pNVar13 == (Node *)0x0) {
            return;
          }
          if (pNVar13->Next == (Node *)0x1) {
            return;
          }
          pNVar7 = pNVar13->Next;
        } while ((pNVar13->Pair).Key != SVar4);
LAB_002c79b5:
        local_38.data1._0_1_ = (pNVar13->Pair).Value;
        local_38.subtype = '\0';
        local_38.type = 2 - (UVar2 == 0x300);
        local_38.data1._1_1_ = 0;
        local_38._4_4_ = 0;
        if ((uchar)local_38.data1 == '\0') {
          return;
        }
        if ((int)SVar3 < 0x100) {
          local_38.data2 = (short)SVar3;
          local_38.data3 = 0;
        }
        goto LAB_002c7b7b;
      }
      local_38.subtype = (UVar2 != 0x300) * '\x02' + '\x01';
      local_38.type = 4;
      uVar1 = (sev->key).keysym.mod;
      local_38._2_4_ = 0;
      local_38.data3 =
           (ushort)((uVar1 & 3) != 0) + (ushort)((uVar1 & 0xc0) != 0) * 2 +
           (ushort)((uVar1 & 0x300) != 0) * 4;
      SVar3 = (sev->key).keysym.scancode;
      if (UVar2 == 0x300) {
        bVar8 = true;
        if (DownState[SVar3] == true) {
          local_38._0_2_ = 0x204;
        }
      }
      else {
        bVar8 = false;
      }
      DownState[SVar3] = bVar8;
      iVar11 = (sev->window).data2;
      switch(iVar11) {
      case 0x4000003a:
        iVar10 = 0xe;
        break;
      case 0x4000003b:
        iVar10 = 0xf;
        break;
      case 0x4000003c:
        iVar10 = 0x10;
        break;
      case 0x4000003d:
        iVar10 = 0x11;
        break;
      case 0x4000003e:
        iVar10 = 0x12;
        break;
      case 0x4000003f:
        local_38.data1 = 0x13;
        iVar10 = 0x13;
        break;
      case 0x40000040:
        local_38.data1 = 0x14;
        iVar10 = 0x14;
        break;
      case 0x40000041:
        local_38.data1 = 0x15;
        iVar10 = 0x15;
        break;
      case 0x40000042:
        local_38.data1 = 0x16;
        iVar10 = 0x16;
        break;
      case 0x40000043:
        local_38.data1 = 0x17;
        iVar10 = 0x17;
        break;
      case 0x40000044:
        local_38.data1 = 0x18;
        iVar10 = 0x18;
        break;
      case 0x40000045:
        local_38.data1 = 0x19;
        iVar10 = 0x19;
        break;
      case 0x40000046:
      case 0x40000047:
      case 0x40000048:
      case 0x40000049:
      case 0x4000004c:
      case 0x40000053:
      case 0x40000054:
      case 0x40000055:
      case 0x40000056:
      case 0x40000057:
switchD_002c7a2b_caseD_40000046:
        iVar10 = 0;
        if ((iVar11 < 0x100) && (iVar10 = iVar11, 0x7f < (short)iVar11)) {
          return;
        }
        break;
      case 0x4000004a:
        iVar10 = 3;
        break;
      case 0x4000004b:
        iVar10 = 2;
        break;
      case 0x4000004d:
        iVar10 = 4;
        break;
      case 0x4000004e:
        iVar10 = 1;
        break;
      case 0x4000004f:
        iVar10 = 6;
        break;
      case 0x40000050:
        iVar10 = 5;
        break;
      case 0x40000051:
        iVar10 = 10;
        break;
      case 0x40000052:
        iVar10 = 0xb;
        break;
      case 0x40000058:
        iVar10 = 0xd;
        break;
      default:
        iVar10 = iVar11;
        if (iVar11 != 0x1b) {
          if (iVar11 != 0x7f) goto switchD_002c7a2b_caseD_40000046;
          iVar10 = 0x1a;
        }
      }
      iVar11 = toupper((int)(short)iVar10);
      sVar9 = (short)iVar11;
    }
    else {
      if (UVar2 != 0x303) {
        return;
      }
      if (!GUICapture) {
        return;
      }
      local_38.type = '\x04';
      local_38.subtype = '\x04';
      local_38.data1 = 0;
      local_38.data2 = 0;
      local_38.data3 = 0;
      sVar9 = (short)(sev->edit).text[0];
    }
  }
  else {
    if (UVar2 - 0x400 < 3) {
      if ((GUICapture) && (((sev->button).button & 0xfe) != 4)) {
        if (UVar2 != 0x400 && 2 < (byte)((sev->button).button - 1)) {
          return;
        }
        SDL_GetMouseState(local_1c,local_20);
        uVar6 = local_38._0_8_;
        local_38.data1 = local_1c[0];
        local_38.data3 = SUB82(uVar6,6);
        local_38.data2 = local_20[0];
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2e])
                  (screen,&local_38.data1,&local_38.data2);
        if (sev->type == 0x400) {
          local_38._0_2_ = 0x604;
        }
        else {
          local_38.subtype = (sev->type == 0x401 ^ 5U) + (char)(sev->display).data1 * '\x03';
          local_38.type = '\x04';
        }
      }
      else {
        if (UVar2 == 0x400) {
          return;
        }
        local_38.type = 2 - (UVar2 == 0x401);
        local_38._1_7_ = 0;
        uVar12 = (sev->button).button - 1;
        if ((8 < (byte)uVar12) || ((0x1bfU >> (uVar12 & 0x1f) & 1) == 0)) {
          pcVar5 = "pov1up";
          if (UVar2 == 0x401) {
            pcVar5 = "pov1down";
          }
          printf("SDL mouse button %s %d\n",pcVar5 + 4);
          return;
        }
        local_38.subtype = '\0';
        local_38.data1 = *(undefined2 *)(&DAT_005d6210 + (ulong)(uVar12 & 0xff) * 2);
        local_38._4_4_ = 0;
      }
      goto LAB_002c7b7b;
    }
    if (1 < UVar2 - 0x603) {
      if (UVar2 != 0x403) {
        return;
      }
      if (GUICapture) {
        local_38._0_8_ = (ulong)CONCAT11(0 < (sev->window).data2,4) ^ 0x1100;
      }
      else {
        local_38._0_8_ = (ulong)CONCAT12(0 < (sev->window).data2,1) ^ 0x1990000;
        D_PostEvent(&local_38);
        local_38.type = 2;
      }
      goto LAB_002c7b7b;
    }
    local_38._1_7_ = 0;
    local_38.type = 2 - (UVar2 == 0x603);
    sVar9 = (sev->display).event + 0x108;
  }
  local_38.data1 = sVar9;
LAB_002c7b7b:
  D_PostEvent(&local_38);
  return;
}

Assistant:

void MessagePump (const SDL_Event &sev)
{
	static int lastx = 0, lasty = 0;
	int x, y;
	event_t event = { 0,0,0,0,0,0,0 };
	
	switch (sev.type)
	{
	case SDL_QUIT:
		exit (0);

	case SDL_WINDOWEVENT:
		switch (sev.window.event)
		{
			case SDL_WINDOWEVENT_FOCUS_GAINED:
			case SDL_WINDOWEVENT_FOCUS_LOST:
				S_SetSoundPaused(sev.window.event == SDL_WINDOWEVENT_FOCUS_GAINED);
				break;
		}
		break;

	case SDL_MOUSEBUTTONDOWN:
	case SDL_MOUSEBUTTONUP:
	case SDL_MOUSEMOTION:
		if (!GUICapture || sev.button.button == 4 || sev.button.button == 5)
		{
			if(sev.type != SDL_MOUSEMOTION)
			{
				event.type = sev.type == SDL_MOUSEBUTTONDOWN ? EV_KeyDown : EV_KeyUp;
				/* These button mappings work with my Gentoo system using the
				* evdev driver and a Logitech MX510 mouse. Whether or not they
				* carry over to other Linux systems, I have no idea, but I sure
				* hope so. (Though buttons 11 and 12 are kind of useless, since
				* they also trigger buttons 4 and 5.)
				*/
				switch (sev.button.button)
				{
				case SDL_BUTTON_LEFT:	event.data1 = KEY_MOUSE1;		break;
				case SDL_BUTTON_MIDDLE:	event.data1 = KEY_MOUSE3;		break;
				case SDL_BUTTON_RIGHT:	event.data1 = KEY_MOUSE2;		break;
				case 8:		event.data1 = KEY_MOUSE4;		break; // For whatever reason my side mouse buttons are here.
				case 9:		event.data1 = KEY_MOUSE5;		break;
				case SDL_BUTTON_X1:		event.data1 = KEY_MOUSE6;		break; // And these don't exist
				case SDL_BUTTON_X2:		event.data1 = KEY_MOUSE7;		break;
				case 6:		event.data1 = KEY_MOUSE8;		break;
				default:	printf("SDL mouse button %s %d\n",
					sev.type == SDL_MOUSEBUTTONDOWN ? "down" : "up", sev.button.button);	break;
				}
				if (event.data1 != 0)
				{
					D_PostEvent(&event);
				}
			}
		}
		else if (sev.type == SDL_MOUSEMOTION || (sev.button.button >= 1 && sev.button.button <= 3))
		{
			int x, y;
			SDL_GetMouseState (&x, &y);

			event.data1 = x;
			event.data2 = y;

			screen->ScaleCoordsFromWindow(event.data1, event.data2);

			event.type = EV_GUI_Event;
			if(sev.type == SDL_MOUSEMOTION)
				event.subtype = EV_GUI_MouseMove;
			else
			{
				event.subtype = sev.type == SDL_MOUSEBUTTONDOWN ? EV_GUI_LButtonDown : EV_GUI_LButtonUp;
				event.subtype += (sev.button.button - 1) * 3;
			}
			D_PostEvent(&event);
		}
		break;

	case SDL_MOUSEWHEEL:
		if (GUICapture)
		{
			event.type = EV_GUI_Event;
			event.subtype = sev.wheel.y > 0 ? EV_GUI_WheelUp : EV_GUI_WheelDown;
			D_PostEvent (&event);
		}
		else
		{
			event.type = EV_KeyDown;
			event.data1 = sev.wheel.y > 0 ? KEY_MWHEELUP : KEY_MWHEELDOWN;
			D_PostEvent (&event);
			event.type = EV_KeyUp;
			D_PostEvent (&event);
		}
		break;

	case SDL_KEYDOWN:
	case SDL_KEYUP:
		if (!GUICapture)
		{
			event.type = sev.type == SDL_KEYDOWN ? EV_KeyDown : EV_KeyUp;

			// Try to look up our key mapped key for conversion to DirectInput.
			// If that fails, then we'll do a lookup against the scan code,
			// which may not return the right key, but at least the key should
			// work in the game.
			if (const BYTE *dik = KeySymToDIK.CheckKey (sev.key.keysym.sym))
				event.data1 = *dik;
			else if (const BYTE *dik = KeyScanToDIK.CheckKey (sev.key.keysym.scancode))
				event.data1 = *dik;

			if (event.data1)
			{
				if (sev.key.keysym.sym < 256)
				{
					event.data2 = sev.key.keysym.sym;
				}
				D_PostEvent (&event);
			}
		}
		else
		{
			event.type = EV_GUI_Event;
			event.subtype = sev.type == SDL_KEYDOWN ? EV_GUI_KeyDown : EV_GUI_KeyUp;
			event.data3 = ((sev.key.keysym.mod & KMOD_SHIFT) ? GKM_SHIFT : 0) |
						  ((sev.key.keysym.mod & KMOD_CTRL) ? GKM_CTRL : 0) |
						  ((sev.key.keysym.mod & KMOD_ALT) ? GKM_ALT : 0);

			if (event.subtype == EV_GUI_KeyDown)
			{
				if (DownState[sev.key.keysym.scancode])
				{
					event.subtype = EV_GUI_KeyRepeat;
				}
				DownState[sev.key.keysym.scancode] = 1;
			}
			else
			{
				DownState[sev.key.keysym.scancode] = 0;
			}

			switch (sev.key.keysym.sym)
			{
			case SDLK_KP_ENTER:	event.data1 = GK_RETURN;	break;
			case SDLK_PAGEUP:	event.data1 = GK_PGUP;		break;
			case SDLK_PAGEDOWN:	event.data1 = GK_PGDN;		break;
			case SDLK_END:		event.data1 = GK_END;		break;
			case SDLK_HOME:		event.data1 = GK_HOME;		break;
			case SDLK_LEFT:		event.data1 = GK_LEFT;		break;
			case SDLK_RIGHT:	event.data1 = GK_RIGHT;		break;
			case SDLK_UP:		event.data1 = GK_UP;		break;
			case SDLK_DOWN:		event.data1 = GK_DOWN;		break;
			case SDLK_DELETE:	event.data1 = GK_DEL;		break;
			case SDLK_ESCAPE:	event.data1 = GK_ESCAPE;	break;
			case SDLK_F1:		event.data1 = GK_F1;		break;
			case SDLK_F2:		event.data1 = GK_F2;		break;
			case SDLK_F3:		event.data1 = GK_F3;		break;
			case SDLK_F4:		event.data1 = GK_F4;		break;
			case SDLK_F5:		event.data1 = GK_F5;		break;
			case SDLK_F6:		event.data1 = GK_F6;		break;
			case SDLK_F7:		event.data1 = GK_F7;		break;
			case SDLK_F8:		event.data1 = GK_F8;		break;
			case SDLK_F9:		event.data1 = GK_F9;		break;
			case SDLK_F10:		event.data1 = GK_F10;		break;
			case SDLK_F11:		event.data1 = GK_F11;		break;
			case SDLK_F12:		event.data1 = GK_F12;		break;
			default:
				if (sev.key.keysym.sym < 256)
				{
					event.data1 = sev.key.keysym.sym;
				}
				break;
			}
			if (event.data1 < 128)
			{
				event.data1 = toupper(event.data1);
				D_PostEvent (&event);
			}
		}
		break;

	case SDL_TEXTINPUT:
		if (GUICapture)
		{
			event.type = EV_GUI_Event;
			event.subtype = EV_GUI_Char;
			event.data1 = sev.text.text[0];
			D_PostEvent (&event);
		}
		break;

	case SDL_JOYBUTTONDOWN:
	case SDL_JOYBUTTONUP:
		event.type = sev.type == SDL_JOYBUTTONDOWN ? EV_KeyDown : EV_KeyUp;
		event.data1 = KEY_FIRSTJOYBUTTON + sev.jbutton.button;
		if(event.data1 != 0)
			D_PostEvent(&event);
		break;
	}
}